

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent.cpp
# Opt level: O0

void __thiscall libtorrent::aux::torrent::maybe_connect_web_seeds(torrent *this)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  session_settings *psVar4;
  pointer pwVar5;
  _List_iterator<libtorrent::aux::web_seed_t> local_30;
  _Self w;
  _Self local_20;
  iterator i;
  time_point32 now;
  int limit;
  torrent *this_local;
  
  if (((((*(ulong *)&(this->super_torrent_hot_members).field_0x48 >> 0x1a & 1) == 0) &&
       (bVar1 = ::std::__cxx11::
                list<libtorrent::aux::web_seed_t,_std::allocator<libtorrent::aux::web_seed_t>_>::
                empty(&this->m_web_seeds), !bVar1)) && (bVar1 = is_finished(this), !bVar1)) &&
     ((((byte)this->field_0x5c0 >> 3 & 1) != 0 &&
      (iVar2 = num_peers(this),
      iVar2 < (int)((uint)((ulong)*(undefined8 *)&(this->super_torrent_hot_members).field_0x48 >>
                          0x21) & 0xffffff))))) {
    iVar2 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger)._vptr_session_logger
              [0x1e])();
    psVar4 = settings(this);
    iVar3 = session_settings::get_int(psVar4,0x4055);
    if (iVar2 < iVar3) {
      psVar4 = settings(this);
      iVar2 = session_settings::get_int(psVar4,0x4083);
      i._M_node._4_4_ = anon_unknown_135::zero_or(iVar2,100);
      i._M_node._0_4_ = time_now32();
      local_20._M_node =
           (_List_node_base *)
           ::std::__cxx11::
           list<libtorrent::aux::web_seed_t,_std::allocator<libtorrent::aux::web_seed_t>_>::begin
                     (&this->m_web_seeds);
      while( true ) {
        w._M_node = (_List_node_base *)
                    ::std::__cxx11::
                    list<libtorrent::aux::web_seed_t,_std::allocator<libtorrent::aux::web_seed_t>_>
                    ::end(&this->m_web_seeds);
        bVar1 = ::std::operator!=(&local_20,&w);
        if (!bVar1 || i._M_node._4_4_ < 1) break;
        local_30._M_node =
             (_List_node_base *)
             ::std::_List_iterator<libtorrent::aux::web_seed_t>::operator++(&local_20,0);
        pwVar5 = ::std::_List_iterator<libtorrent::aux::web_seed_t>::operator->(&local_30);
        if (((pwVar5->disabled & 1U) == 0) &&
           (pwVar5 = ::std::_List_iterator<libtorrent::aux::web_seed_t>::operator->(&local_30),
           (pwVar5->removed & 1U) == 0)) {
          pwVar5 = ::std::_List_iterator<libtorrent::aux::web_seed_t>::operator->(&local_30);
          bVar1 = ::std::chrono::operator>
                            ((time_point<std::chrono::_V2::system_clock,_std::chrono::duration<int,_std::ratio<1L,_1L>_>_>
                              *)&(pwVar5->super_web_seed_entry).field_0x5c,
                             (time_point<std::chrono::_V2::system_clock,_std::chrono::duration<int,_std::ratio<1L,_1L>_>_>
                              *)&i);
          if ((!bVar1) &&
             (pwVar5 = ::std::_List_iterator<libtorrent::aux::web_seed_t>::operator->(&local_30),
             (pwVar5->interesting & 1U) != 0)) {
            i._M_node._4_4_ = i._M_node._4_4_ + -1;
            pwVar5 = ::std::_List_iterator<libtorrent::aux::web_seed_t>::operator->(&local_30);
            if (((pwVar5->peer_info).super_torrent_peer.connection ==
                 (peer_connection_interface *)0x0) &&
               (pwVar5 = ::std::_List_iterator<libtorrent::aux::web_seed_t>::operator->(&local_30),
               (pwVar5->resolving & 1U) == 0)) {
              connect_to_url_seed(this,(iterator)local_30._M_node);
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

void torrent::maybe_connect_web_seeds()
	{
		if (m_abort) return;

		// if we have everything we want we don't need to connect to any web-seed
		if (m_web_seeds.empty()
			|| is_finished()
			|| !m_files_checked
			|| num_peers() >= int(m_max_connections)
			|| m_ses.num_connections() >= settings().get_int(settings_pack::connections_limit))
		{
			return;
		}

		// when set to unlimited, use 100 as the limit
		int limit = zero_or(settings().get_int(settings_pack::max_web_seed_connections)
			, 100);

		auto const now = aux::time_now32();

		// keep trying web-seeds if there are any
		// first find out which web seeds we are connected to
		for (auto i = m_web_seeds.begin(); i != m_web_seeds.end() && limit > 0;)
		{
			auto const w = i++;
			if (w->disabled || w->removed || w->retry > now || !w->interesting)
				continue;

			--limit;
			if (w->peer_info.connection || w->resolving)
				continue;

			connect_to_url_seed(w);
		}
	}